

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VCFace::VCFace(VCFace *this,int v1,int v2,int v3,VertexGroup *vg,VCCluster *c)

{
  _Rb_tree_header *p_Var1;
  ResScalar __x;
  double dVar2;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar3;
  Vec3d *B;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  Vec3d local_1a0;
  Nested local_188;
  undefined8 uStack_180;
  type local_178;
  undefined8 uStack_170;
  Vector4d plane;
  Vec3d local_140;
  Nested local_128;
  double dStack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  type local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  double local_d0;
  CoeffBasedProduct<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_256>
  local_c8;
  
  this->v1 = v1;
  this->v2 = v2;
  this->v3 = v3;
  p_Var1 = &(this->neighbor)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cluster = c;
  B = (Vec3d *)(&vg->field_0x8 + (long)v1 * 0x50);
  operator-((Vec3d *)(&vg->field_0x8 + (long)v2 * 0x50),B);
  local_178 = local_c8.m_lhs;
  uStack_170 = 0;
  local_188 = local_c8.m_rhs.m_matrix;
  uStack_180 = local_c8.m_result.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[0];
  Vec3d::~Vec3d((Vec3d *)&local_c8);
  operator-((Vec3d *)(&vg->field_0x8 + (long)v3 * 0x50),B);
  local_108 = local_c8.m_lhs;
  uStack_100 = 0;
  uStack_110 = SUB84(local_178,0);
  uStack_10c = (undefined4)((ulong)local_178 >> 0x20);
  local_118 = (undefined4)uStack_180;
  uStack_114 = uStack_180._4_4_;
  local_f8 = (double)local_c8.m_lhs * (double)local_188;
  uStack_f0 = 0;
  local_128 = local_c8.m_rhs.m_matrix;
  dStack_120 = local_c8.m_result.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
               m_storage.m_data.array[0];
  Vec3d::~Vec3d((Vec3d *)&local_c8);
  local_1b8 = dStack_120 * (double)local_188 -
              (double)CONCAT44(uStack_114,local_118) * (double)local_128;
  dStack_1b0 = (double)local_108 * uStack_180 - (double)CONCAT44(uStack_10c,uStack_110) * dStack_120
  ;
  local_1a8 = (double)local_178 * (double)local_128 - local_f8;
  local_e8 = B->x;
  uStack_e0 = *(undefined8 *)(&vg->field_0x10 + (long)v1 * 0x50);
  local_d8 = *(undefined8 *)(&vg->field_0x18 + (long)v1 * 0x50);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
            ((PlainObject *)&local_c8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1b8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  lazyAssign<Eigen::Matrix<double,3,1,0,3,1>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->normal,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_c8);
  __x = Eigen::internal::
        dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
        ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1b8,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1b8);
  if (__x < 0.0) {
    dVar2 = sqrt(__x);
  }
  else {
    dVar2 = SQRT(__x);
  }
  this->area = dVar2 * 0.5;
  operator+(B,(Vec3d *)(&vg->field_0x8 + (long)v2 * 0x50));
  operator+(&local_140,(Vec3d *)(&vg->field_0x8 + (long)v3 * 0x50));
  local_d0 = 3.0;
  operator/(&local_1a0,&local_d0);
  local_c8.m_lhs =
       (type)plane.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
             array[0];
  local_c8.m_rhs.m_matrix =
       (Nested)plane.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array[1];
  local_c8.m_result.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0] = plane.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
             array[2];
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::swap<Eigen::Matrix<double,3,1,0,3,1>>
            ((DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_c8,
             &(this->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>);
  Vec3d::~Vec3d((Vec3d *)&plane);
  Vec3d::~Vec3d(&local_1a0);
  Vec3d::~Vec3d(&local_140);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1b8);
  local_c8.m_rhs.m_matrix = (Nested)0x0;
  local_c8.m_result.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0] = 4.94065645841247e-324;
  local_c8.m_result.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[1] = 4.94065645841247e-324;
  plane.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_1b8;
  local_c8.m_lhs = (type)&plane;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_c8,
                      &dStack_1b0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     (pCVar3,&local_1a8);
  local_1a0.x = Eigen::internal::
                dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1b8,
                      (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_e8);
  local_1a0.x = -local_1a0.x;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar3,&local_1a0.x);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_c8);
  local_c8.m_lhs = (type)&plane;
  local_c8.m_rhs.m_matrix = (Nested)&plane;
  Eigen::internal::
  assign_innervec_CompleteUnrolling<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_256>,_0,_16>
  ::run(&this->E,&local_c8);
  VCCluster::addItem(c,this);
  return;
}

Assistant:

VCFace::VCFace(int v1, int v2, int v3, VertexGroup* vg, VCCluster* c)
	:v1(v1), v2(v2), v3(v3), cluster(c)
{
	Vertex* p1 = &vg->group[v1];
	Vertex* p2 = &vg->group[v2];
	Vertex* p3 = &vg->group[v3];
	Vector3d u = VCMyvecToEigen(p2->pos - p1->pos);
	Vector3d v = VCMyvecToEigen(p3->pos - p1->pos);
	Vector3d n(u.cross(v)), a(VCMyvecToEigen(p1->pos));
	normal = n.normalized();
	area = 0.5 * sqrt(n.dot(n));
	center = VCMyvecToEigen((p1->pos + p2->pos + p3->pos) / 3);
	n.normalize();
	Vector4d plane;
	plane << n.x() , n.y() , n.z() ,-n.dot(a); 
	E = plane * plane.transpose();
	c->addItem(this);
}